

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_VerifyErrorCheck_Test::TestBody(TransactionContext_VerifyErrorCheck_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  reference pvVar5;
  AssertionResult gtest_ar_2;
  CfdException *except_2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures3;
  SignParameter sign1;
  SignParameter sign2;
  ByteData signature1;
  ByteData signature2;
  ByteData256 sighash3;
  OutPoint outpoint3;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  OutPoint outpoint2;
  AssertionResult gtest_ar;
  CfdException *except;
  Script scriptSig;
  OutPoint outpoint1;
  ByteData tx;
  SigHashType sighash_type;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Address address2;
  Address address;
  UtxoData utxo3;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  undefined8 in_stack_ffffffffffffcd28;
  UtxoData *in_stack_ffffffffffffcd30;
  AddressFactory *in_stack_ffffffffffffcd38;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffcd40;
  SigHashType *in_stack_ffffffffffffcd58;
  undefined4 in_stack_ffffffffffffcd60;
  AddressType in_stack_ffffffffffffcd64;
  iterator in_stack_ffffffffffffcd68;
  SignParameter *in_stack_ffffffffffffcd70;
  TransactionContext *this_00;
  TransactionContext *outpoint;
  UtxoData *in_stack_ffffffffffffcd90;
  UtxoData *in_stack_ffffffffffffcd98;
  UtxoData *in_stack_ffffffffffffcda0;
  Address *in_stack_ffffffffffffcda8;
  allocator *paVar6;
  TransactionContext *in_stack_ffffffffffffcdb0;
  undefined6 in_stack_ffffffffffffcdb8;
  undefined1 in_stack_ffffffffffffcdbe;
  SigHashType *in_stack_ffffffffffffcdc0;
  undefined6 in_stack_ffffffffffffcdc8;
  undefined1 in_stack_ffffffffffffcdce;
  OutPoint *outpoint_00;
  TransactionContext *in_stack_ffffffffffffcdd8;
  undefined6 in_stack_ffffffffffffcde8;
  undefined1 in_stack_ffffffffffffcdee;
  WitnessVersion in_stack_ffffffffffffcdf0;
  undefined4 in_stack_ffffffffffffcdf4;
  undefined8 ****local_3180;
  Privkey *local_3148;
  Pubkey *local_3100;
  TransactionContext local_3070;
  undefined1 local_2f80 [180];
  SigHashType local_2ecc [11];
  ByteData local_2e48;
  ByteData local_2e30;
  SigHashType local_2e14;
  ByteData local_2e08;
  ByteData256 local_2df0;
  OutPoint local_2dd8 [2];
  AssertHelper local_2d88;
  Message local_2d80;
  SigHashType local_2d78;
  allocator local_2d69;
  string local_2d68;
  Privkey local_2d48;
  allocator local_2d21;
  string local_2d20 [15];
  undefined1 in_stack_ffffffffffffd2ef;
  undefined8 in_stack_ffffffffffffd2f0;
  undefined8 in_stack_ffffffffffffd2f8;
  Pubkey *in_stack_ffffffffffffd300;
  OutPoint *in_stack_ffffffffffffd308;
  TransactionContext *in_stack_ffffffffffffd310;
  ByteData256 *in_stack_ffffffffffffd320;
  ByteData *in_stack_ffffffffffffd328;
  AssertHelper local_2c98;
  Message local_2c90;
  OutPoint local_2c81;
  Script local_2c48;
  ByteData local_2c10;
  ByteData local_2bf8;
  Script local_2be0;
  AssertHelper local_2ba8;
  Message local_2ba0;
  SigHashType local_2b98;
  undefined1 local_2b89 [105];
  Pubkey local_2b20;
  OutPoint local_2b08;
  ByteData local_2ae0;
  AssertHelper local_2ac8;
  Message local_2ac0 [2];
  SigHashType local_2ab0;
  undefined1 ****local_2aa0;
  undefined8 ***local_2a98 [114];
  OutPoint *in_stack_ffffffffffffd8f8;
  TransactionContext *in_stack_ffffffffffffd900;
  undefined1 local_25a8 [1264];
  undefined1 local_20b8 [1264];
  undefined1 ****local_1bc8;
  undefined8 local_1bc0;
  Transaction local_1ba0 [2];
  allocator local_1ae1;
  string local_1ae0;
  Address local_1ac0;
  allocator local_1941;
  string local_1940;
  Address local_1920;
  Amount local_17a8;
  Script local_1798;
  Address local_1760;
  Script local_15e8;
  allocator local_15a9;
  string local_15a8;
  Txid local_1588;
  undefined8 local_1568;
  Txid local_1540;
  uint32_t local_1520;
  Script local_1518;
  Script local_14e0;
  Address local_14a8;
  string local_1330 [32];
  int64_t local_1310;
  undefined1 local_1308;
  undefined4 local_1300;
  undefined8 local_12f8;
  undefined1 local_1072;
  allocator local_1071;
  string local_1070;
  allocator local_1049;
  string local_1048;
  allocator local_1021;
  string local_1020;
  Privkey *local_1000;
  Privkey local_ff8;
  Privkey local_fd8;
  Privkey local_fb8;
  undefined1 local_f98 [46];
  undefined1 local_f6a;
  allocator local_f69;
  string local_f68;
  allocator local_f41;
  string local_f40;
  allocator local_f19;
  string local_f18;
  Pubkey *local_ef8;
  Pubkey local_ef0;
  Pubkey local_ed8;
  Pubkey local_ec0;
  undefined1 local_ea8 [40];
  Amount local_e80;
  Script local_e70;
  allocator local_e31;
  string local_e30 [32];
  Address local_e10;
  allocator local_c91;
  string local_c90;
  Txid local_c70;
  undefined8 local_c50;
  Txid local_c28;
  uint32_t local_c08;
  Script local_c00 [2];
  Address local_b90;
  string local_a18 [32];
  int64_t local_9f8;
  undefined1 local_9f0;
  undefined4 local_9e8;
  undefined8 local_9e0;
  Amount local_760;
  Script local_750;
  allocator local_711;
  string local_710 [32];
  Address local_6f0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0 [2];
  Address local_460;
  string local_2e8 [32];
  int64_t local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffcd30,
             (NetType)((ulong)in_stack_ffffffffffffcd28 >> 0x20));
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcd90);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x24ced6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,"2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi",&local_711);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcd38,(string *)in_stack_ffffffffffffcd30);
  cfd::core::Address::operator=(&local_460,&local_6f0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcd30);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  cfd::core::Address::GetLockingScript(&local_750,&local_460);
  cfd::core::Script::operator=(local_4d0,&local_750);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  std::__cxx11::string::operator=
            (local_2e8,
             "sh(wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))");
  cfd::core::Amount::Amount(&local_760,10000000);
  local_2c0 = local_760.ignore_check_;
  local_2c8 = local_760.amount_;
  local_2b8 = 6;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcd90);
  local_c50 = 0;
  local_9e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c90,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_c91);
  cfd::core::Txid::Txid(&local_c70,&local_c90);
  cfd::core::Txid::operator=(&local_c28,&local_c70);
  cfd::core::Txid::~Txid((Txid *)0x24d0ae);
  std::__cxx11::string::~string((string *)&local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  local_c08 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e30,"bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn",&local_e31);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcd38,(string *)in_stack_ffffffffffffcd30);
  cfd::core::Address::operator=(&local_b90,&local_e10);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcd30);
  std::__cxx11::string::~string(local_e30);
  std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  cfd::core::Address::GetLockingScript(&local_e70,&local_b90);
  cfd::core::Script::operator=(local_c00,&local_e70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  std::__cxx11::string::operator=
            (local_a18,"wpkh(03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)");
  cfd::core::Amount::Amount(&local_e80,10000);
  local_9f0 = local_e80.ignore_check_;
  local_9f8 = local_e80.amount_;
  local_9e8 = 4;
  local_f6a = 1;
  local_ef8 = &local_ef0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f18,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_f19);
  cfd::core::Pubkey::Pubkey(&local_ef0,&local_f18);
  local_ef8 = &local_ed8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f40,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",&local_f41);
  cfd::core::Pubkey::Pubkey(&local_ed8,&local_f40);
  local_ef8 = &local_ec0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f68,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae",&local_f69);
  cfd::core::Pubkey::Pubkey(&local_ec0,&local_f68);
  local_f6a = 0;
  local_ea8._0_8_ = &local_ef0;
  local_ea8._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x24d350);
  __l._M_len = (size_type)in_stack_ffffffffffffcd70;
  __l._M_array = (iterator)in_stack_ffffffffffffcd68;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             CONCAT44(in_stack_ffffffffffffcd64,in_stack_ffffffffffffcd60),__l,
             (allocator_type *)in_stack_ffffffffffffcd58);
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x24d384);
  local_3100 = (Pubkey *)local_ea8;
  do {
    local_3100 = local_3100 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x24d3b9);
  } while (local_3100 != &local_ef0);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::__cxx11::string::~string((string *)&local_f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_f41);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  local_1072 = 1;
  local_1000 = &local_ff8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1020,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
             &local_1021);
  cfd::core::Privkey::FromWif(&local_ff8,&local_1020,kTestnet,true);
  local_1000 = &local_fd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1048,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",
             &local_1049);
  cfd::core::Privkey::FromWif(&local_fd8,&local_1048,kTestnet,true);
  local_1000 = &local_fb8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1070,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",
             &local_1071);
  cfd::core::Privkey::FromWif(&local_fb8,&local_1070,kTestnet,true);
  local_1072 = 0;
  local_f98._0_8_ = &local_ff8;
  local_f98._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Privkey>::allocator((allocator<cfd::core::Privkey> *)0x24d598);
  __l_00._M_len = (size_type)in_stack_ffffffffffffcd70;
  __l_00._M_array = (iterator)in_stack_ffffffffffffcd68;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             CONCAT44(in_stack_ffffffffffffcd64,in_stack_ffffffffffffcd60),__l_00,
             (allocator_type *)in_stack_ffffffffffffcd58);
  std::allocator<cfd::core::Privkey>::~allocator((allocator<cfd::core::Privkey> *)0x24d5cc);
  local_3148 = (Privkey *)local_f98;
  do {
    local_3148 = local_3148 + -1;
    cfd::core::Privkey::~Privkey((Privkey *)0x24d601);
  } while (local_3148 != &local_ff8);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcd90);
  local_1568 = 0;
  local_12f8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_15a8,
             "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_15a9);
  cfd::core::Txid::Txid(&local_1588,&local_15a8);
  cfd::core::Txid::operator=(&local_1540,&local_1588);
  cfd::core::Txid::~Txid((Txid *)0x24d701);
  std::__cxx11::string::~string((string *)&local_15a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
  local_1520 = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_15e8,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_ea8 + 0x10),
             true);
  cfd::core::Script::operator=(&local_14e0,&local_15e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  cfd::AddressFactory::CreateP2shAddress
            (in_stack_ffffffffffffcd38,(Script *)in_stack_ffffffffffffcd30);
  cfd::core::Address::operator=(&local_14a8,&local_1760);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcd30);
  cfd::core::Address::GetLockingScript(&local_1798,&local_14a8);
  cfd::core::Script::operator=(&local_1518,&local_1798);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  std::__cxx11::string::operator=
            (local_1330,
             "wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))"
            );
  cfd::core::Amount::Amount(&local_17a8,180000);
  local_1308 = local_17a8.ignore_check_;
  local_1310 = local_17a8.amount_;
  local_1300 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1940,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_1941);
  cfd::core::Address::Address(&local_1920,&local_1940);
  std::__cxx11::string::~string((string *)&local_1940);
  std::allocator<char>::~allocator((allocator<char> *)&local_1941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1ae0,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1ae1);
  cfd::core::Address::Address(&local_1ac0,&local_1ae0);
  std::__cxx11::string::~string((string *)&local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffcd30,
             (uint32_t)((ulong)in_stack_ffffffffffffcd28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffcd28);
  local_2aa0 = (undefined1 ****)local_2a98;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcda0,in_stack_ffffffffffffcd98);
  local_2aa0 = (undefined1 ****)local_25a8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcda0,in_stack_ffffffffffffcd98);
  local_2aa0 = (undefined1 ****)local_20b8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcda0,in_stack_ffffffffffffcd98);
  local_1bc8 = (undefined1 ****)local_2a98;
  local_1bc0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x24d9a8);
  __l_01._M_len = (size_type)in_stack_ffffffffffffcd70;
  __l_01._M_array = in_stack_ffffffffffffcd68;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffcd64,in_stack_ffffffffffffcd60),__l_01,
             (allocator_type *)in_stack_ffffffffffffcd58);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x24d9dc);
  local_3180 = &local_1bc8;
  do {
    local_3180 = local_3180 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcd30);
  } while (local_3180 != local_2a98);
  cfd::core::SigHashType::SigHashType(&local_2ab0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInputs
                ((TransactionContext *)CONCAT44(in_stack_ffffffffffffcd64,in_stack_ffffffffffffcd60)
                 ,(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffcd58
                );
    }
  }
  else {
    testing::Message::Message(local_2ac0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ac8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x287,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2ac8,local_2ac0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ac8);
    testing::Message::~Message((Message *)0x24e3be);
  }
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffcdb0,in_stack_ffffffffffffcda8,(Amount *)in_stack_ffffffffffffcda0
            );
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffcdb0,in_stack_ffffffffffffcda8,(Amount *)in_stack_ffffffffffffcda0
            );
  cfd::core::ByteData::ByteData(&local_2ae0);
  cfd::core::OutPoint::OutPoint(&local_2b08,&local_4f8,local_4d8);
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_ffffffffffffcdee = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffcdee) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2b89 + 0x49),
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)((long)local_2b89 + 0x48));
      cfd::core::Pubkey::Pubkey(&local_2b20,(string *)(local_2b89 + 0x49));
      in_stack_ffffffffffffcdd8 = (TransactionContext *)local_2b89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_2b89 + 1),
                 "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 (allocator *)in_stack_ffffffffffffcdd8);
      cfd::core::Privkey::FromWif
                ((Privkey *)((long)local_2b89 + 0x21),(string *)((long)local_2b89 + 1),kTestnet,true
                );
      cfd::core::SigHashType::SigHashType(&local_2b98);
      in_stack_ffffffffffffcd30 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd310,in_stack_ffffffffffffd308,in_stack_ffffffffffffd300,
                 (Privkey *)in_stack_ffffffffffffd2f8,(SigHashType *)in_stack_ffffffffffffd2f0,
                 (bool)in_stack_ffffffffffffd2ef,in_stack_ffffffffffffd320,in_stack_ffffffffffffd328
                );
      cfd::core::Privkey::~Privkey((Privkey *)0x24e5ae);
      std::__cxx11::string::~string((string *)((long)local_2b89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2b89);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x24e5d5);
      std::__cxx11::string::~string((string *)(local_2b89 + 0x49));
      std::allocator<char>::~allocator((allocator<char> *)((long)local_2b89 + 0x48));
    }
  }
  else {
    testing::Message::Message(&local_2ba0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x292,
               "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2ba8,&local_2ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ba8);
    testing::Message::~Message((Message *)0x24e78d);
  }
  outpoint_00 = &local_2c81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_2c81.txid_._vptr_Txid + 1),
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
             (allocator *)outpoint_00);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)((long)&local_2c81.vout_ + 1),
             (string *)((long)&local_2c81.txid_._vptr_Txid + 1));
  cfd::core::ScriptUtil::CreateP2wpkhLockingScript
            (&local_2c48,(Pubkey *)((long)&local_2c81.vout_ + 1));
  cfd::core::Script::GetData(&local_2c10,&local_2c48);
  cfd::core::ByteData::Serialize(&local_2bf8,&local_2c10);
  cfd::core::Script::Script(&local_2be0,&local_2bf8);
  cfd::core::ByteData::~ByteData((ByteData *)0x24e88b);
  cfd::core::ByteData::~ByteData((ByteData *)0x24e898);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x24e8b2);
  std::__cxx11::string::~string((string *)((long)&local_2c81.txid_._vptr_Txid + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2c81);
  uVar3 = testing::internal::AlwaysTrue();
  if ((bool)uVar3) {
    in_stack_ffffffffffffcdce = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffcdce) {
      cfd::core::Transaction::SetUnlockingScript(local_1ba0,0,&local_2be0);
    }
  }
  else {
    testing::Message::Message(&local_2c90);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x296,
               "Expected: txc.SetUnlockingScript(0, scriptSig) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2c98,&local_2c90);
    testing::internal::AssertHelper::~AssertHelper(&local_2c98);
    testing::Message::~Message((Message *)0x24eabf);
  }
  cfd::TransactionContext::Verify(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  cfd::core::OutPoint::OutPoint((OutPoint *)&stack0xffffffffffffd318,&local_c28,local_c08);
  uVar4 = testing::internal::AlwaysTrue();
  if ((bool)uVar4) {
    in_stack_ffffffffffffcdbe = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffcdbe) {
      paVar6 = &local_2d21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d20,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
                 paVar6);
      cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffd300,(string *)local_2d20);
      paVar6 = &local_2d69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d68,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",paVar6
                );
      cfd::core::Privkey::FromWif(&local_2d48,&local_2d68,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2d78);
      in_stack_ffffffffffffcd30 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd310,in_stack_ffffffffffffd308,in_stack_ffffffffffffd300,
                 (Privkey *)in_stack_ffffffffffffd2f8,(SigHashType *)in_stack_ffffffffffffd2f0,
                 (bool)in_stack_ffffffffffffd2ef,in_stack_ffffffffffffd320,in_stack_ffffffffffffd328
                );
      cfd::core::Privkey::~Privkey((Privkey *)0x24ee2d);
      std::__cxx11::string::~string((string *)&local_2d68);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d69);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x24ee54);
      std::__cxx11::string::~string(local_2d20);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d21);
    }
  }
  else {
    testing::Message::Message(&local_2d80);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x2a2,
               "Expected: txc.SignWithKey(outpoint2, Pubkey(\"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281\"), Privkey::FromWif( \"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d88,&local_2d80);
    testing::internal::AssertHelper::~AssertHelper(&local_2d88);
    testing::Message::~Message((Message *)0x24f00c);
  }
  cfd::TransactionContext::Verify(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  cfd::core::OutPoint::OutPoint(local_2dd8,&local_1540,local_1520);
  cfd::core::SigHashType::SigHashType(&local_2e14,&local_2ab0);
  cfd::TransactionContext::CreateSignatureHash
            (in_stack_ffffffffffffcdd8,outpoint_00,
             (Script *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffcdce,in_stack_ffffffffffffcdc8))
             ,in_stack_ffffffffffffcdc0,
             (Amount *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffcdbe,in_stack_ffffffffffffcdb8))
             ,in_stack_ffffffffffffcdf0);
  cfd::core::ByteData256::ByteData256(&local_2df0,&local_2e08);
  cfd::core::ByteData::~ByteData((ByteData *)0x24f2b9);
  pvVar5 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_f98 + 0x10),2);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2e30,&local_2df0,pvVar5,true);
  pvVar5 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_f98 + 0x10),1);
  cfd::core::SignatureUtil::CalculateEcSignature(&local_2e48,&local_2df0,pvVar5,true);
  cfd::core::SigHashType::SigHashType(local_2ecc,&local_2ab0);
  cfd::SignParameter::SignParameter
            (in_stack_ffffffffffffcd70,(ByteData *)in_stack_ffffffffffffcd68,
             SUB41(in_stack_ffffffffffffcd64 >> 0x18,0),in_stack_ffffffffffffcd58);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_2f80 + 0x2c),&local_2ab0);
  cfd::SignParameter::SignParameter
            (in_stack_ffffffffffffcd70,(ByteData *)in_stack_ffffffffffffcd68,
             SUB41(in_stack_ffffffffffffcd64 >> 0x18,0),in_stack_ffffffffffffcd58);
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0),
             (SignParameter *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffcdee,in_stack_ffffffffffffcde8)));
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0),
             (SignParameter *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffcdee,in_stack_ffffffffffffcde8)));
  local_2f80._0_8_ = &local_3070;
  local_2f80._8_8_ = (void *)0x2;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x24f3fd);
  __l_02._M_len = (size_type)in_stack_ffffffffffffcd70;
  __l_02._M_array = (iterator)in_stack_ffffffffffffcd68;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT44(in_stack_ffffffffffffcd64,in_stack_ffffffffffffcd60),__l_02,
             (allocator_type *)in_stack_ffffffffffffcd58);
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x24f42e);
  outpoint = &local_3070;
  this_00 = (TransactionContext *)local_2f80;
  do {
    this_00 = (TransactionContext *)&this_00[-1].utxo_map_;
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffcd30);
  } while (this_00 != outpoint);
  cfd::TransactionContext::AddMultisigSign
            (this_00,(OutPoint *)outpoint,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00,
             (Script *)in_stack_ffffffffffffcd68,in_stack_ffffffffffffcd64);
  cfd::TransactionContext::Verify(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            (in_stack_ffffffffffffcd40);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffcd30);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffcd30);
  cfd::core::ByteData::~ByteData((ByteData *)0x24f826);
  cfd::core::ByteData::~ByteData((ByteData *)0x24f833);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x24f840);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24f84d);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24f85a);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcd30);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24f874);
  cfd::core::ByteData::~ByteData((ByteData *)0x24f881);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffcd40);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffcd30);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcd30);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcd30);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcd30);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffcd40);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffcd40);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcd30);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcd30);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x24f903);
  return;
}

Assistant:

TEST(TransactionContext, VerifyErrorCheck)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1 (p2sh-p2wpkh)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.address = factory.GetAddress("2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi");
  utxo1.locking_script = utxo1.address.GetLockingScript();
  utxo1.descriptor = "sh(wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2shP2wpkhAddress;

  // Address2 (p2wpkh)
  // pubkey: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 2;
  utxo2.address = factory.GetAddress("bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn");
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "wpkh(03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)";
  utxo2.amount = Amount(int64_t{10000});
  utxo2.address_type = AddressType::kP2wpkhAddress;

  // Address3 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 1;
  utxo3.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo3.address = factory.CreateP2shAddress(utxo3.redeem_script);
  utxo3.locking_script = utxo3.address.GetLockingScript();
  utxo3.descriptor = "wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))";
  utxo3.amount = Amount(int64_t{180000});
  utxo3.address_type = AddressType::kP2wshAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  TransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  SigHashType sighash_type;

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount);
  txc.AddTxOut(address2, utxo2.amount);

  ByteData tx;

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  Script scriptSig(ScriptUtil::CreateP2wpkhLockingScript(
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"))
        .GetData().Serialize());
  EXPECT_NO_THROW(txc.SetUnlockingScript(0, scriptSig));
  try {
    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("p2sh-p2wpkh scriptsig unmatch.", except.what());
  }

  // sign2
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint2,
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
      Privkey::FromWif(
          "cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet)));
  try {
    txc.Verify(outpoint2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Unmatch locking script.", except.what());
  }

  // sign3
  OutPoint outpoint3(utxo3.txid, utxo3.vout);
  ByteData256 sighash3 = ByteData256(txc.CreateSignatureHash(outpoint3,
      utxo3.redeem_script, sighash_type, utxo3.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  SignParameter sign1(signature1, true, sighash_type);
  std::vector<SignParameter> signatures3 = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint3, signatures3, utxo3.redeem_script, utxo3.address_type);
  try {
    txc.Verify(outpoint3);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Signature order is incorrect.", except.what());
  }
}